

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_quadrature.hpp
# Opt level: O0

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::
  quadrature_traits<IntegratorXX::ProductQuadrature<IntegratorXX::detail::spherical_combine_op<double>,_IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Delley<double>_>,_void>
  ::generate(tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,
            Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>_>
            *q1,Quadrature<IntegratorXX::Delley<double>_> *q2)

{
  pointer __n;
  size_t sVar1;
  size_t sVar2;
  point_container *this;
  weight_container *this_00;
  point_container *this_01;
  const_reference pvVar3;
  const_reference a;
  reference pvVar4;
  const_reference y;
  reference pvVar5;
  double dVar6;
  cartesian_pt_t<double> local_e0;
  size_type local_c8;
  size_t ij;
  size_t i;
  size_t j;
  weight_container *pwStack_a8;
  spherical_combine_op<double> op;
  weight_container *weights2;
  point_container *points2;
  weight_container *weights1;
  point_container *points1;
  undefined1 local_80 [8];
  weight_container weights;
  allocator<std::array<double,_3UL>_> local_51;
  undefined1 local_50 [8];
  point_container points;
  size_t npts;
  size_t npts2;
  size_t npts1;
  Quadrature<IntegratorXX::Delley<double>_> *q2_local;
  Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>_>
  *q1_local;
  
  sVar1 = QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
          ::npts(&q1->
                  super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                );
  sVar2 = QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
          ::npts(&q2->
                  super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                );
  points.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(sVar1 * sVar2);
  std::allocator<std::array<double,_3UL>_>::allocator(&local_51);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_50,
             (size_type)(sVar1 * sVar2),&local_51);
  std::allocator<std::array<double,_3UL>_>::~allocator(&local_51);
  __n = points.
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<double>::allocator((allocator<double> *)((long)&points1 + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_80,(size_type)__n,
             (allocator<double> *)((long)&points1 + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&points1 + 7));
  this = QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
         ::points(&q1->
                   super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                 );
  this_00 = QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
            ::weights(&q1->
                       super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                     );
  this_01 = QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
            ::points(&q2->
                      super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                    );
  pwStack_a8 = QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
               ::weights(&q2->
                          super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                        );
  for (i = 0; i < sVar2; i = i + 1) {
    for (ij = 0; ij < sVar1; ij = ij + 1) {
      local_c8 = ij + i * sVar1;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this,ij);
      a = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
          operator[](this_01,i);
      detail::spherical_combine_op<double>::operator()
                (&local_e0,(spherical_combine_op<double> *)((long)&j + 7),pvVar3,a);
      pvVar4 = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
               operator[]((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                           *)local_50,local_c8);
      pvVar4->_M_elems[0] = local_e0._M_elems[0];
      pvVar4->_M_elems[1] = local_e0._M_elems[1];
      pvVar4->_M_elems[2] = local_e0._M_elems[2];
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,ij);
      y = std::vector<double,_std::allocator<double>_>::operator[](pwStack_a8,i);
      dVar6 = detail::spherical_combine_op<double>::operator()
                        ((spherical_combine_op<double> *)((long)&j + 7),pvVar3,y);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_80,local_c8);
      *pvVar5 = dVar6;
    }
  }
  std::
  make_tuple<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&>
            (__return_storage_ptr__,
             (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_50,
             (vector<double,_std::allocator<double>_> *)local_80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_80);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
            ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_50)
  ;
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( const Quadrature<Quad1>& q1, const Quadrature<Quad2>& q2 ) {

    const auto npts1 = q1.npts();
    const auto npts2 = q2.npts();

    const auto npts = npts1 * npts2;
    point_container  points( npts );
    weight_container weights( npts );
    
    const auto& points1  = q1.points();
    const auto& weights1 = q1.weights();
    const auto& points2  = q2.points();
    const auto& weights2 = q2.weights();

    CombineOp op;

    for( size_t j = 0; j < npts2; ++j ) 
    for( size_t i = 0; i < npts1; ++i ) {

      const auto ij = i + j*npts1;
      points[ij]  = op(points1[i],  points2[j] );
      weights[ij] = op(weights1[i], weights2[j]);

    }

    return std::make_tuple( points, weights );
  }